

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::warning<char_const(&)[175],std::__cxx11::string>
          (Reporter *this,char (*args) [175],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_t sVar1;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  basic_string_view<char> in_stack_ffffffffffffff58;
  
  std::char_traits<char>::length((char_type *)0x23a151);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff50,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff48);
  sVar1 = std::char_traits<char>::length((char_type *)0x23a1e7);
  ::fmt::v10::print<std::__cxx11::string>
            (in_RSI,(format_string<std::__cxx11::basic_string<char>_>)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff48);
  std::char_traits<char>::length((char_type *)0x23a273);
  ::fmt::v10::print<>(in_RSI,(format_string<>)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }